

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgenericshape.cpp
# Opt level: O3

void ComputeTransforms<pzshape::TPZShapePoint>
               (TPZVec<long> *id,TPZVec<TPZTransform<double>_> *transvec)

{
  (*transvec->_vptr_TPZVec[4])(transvec,0);
  return;
}

Assistant:

void ComputeTransforms(const TPZVec<int64_t> &id,  TPZVec<TPZTransform<REAL> > &transvec) {
    int NSides = TSHAPE::NSides;
    int NCorners = TSHAPE::NCornerNodes;
    transvec.resize(NSides - NCorners);
    for (int iside = NCorners; iside< NSides ; iside++) {
        int pos = iside - NCorners;
        int trans_id = TSHAPE::GetTransformId(iside, id); // Foi criado
        transvec[pos] = GetSideTransform<TSHAPE>(iside, trans_id); // Foi criado
    }
}